

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::toStringInternal(LatticeImpl *this,StringBuffer *os)

{
  ssize_t sVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  
  os->size_ = 0;
  if (this->writer_ == (Writer *)0x0) {
    anon_unknown_3::writeLattice(&this->super_Lattice,os);
    __buf = extraout_RDX_00;
  }
  else {
    sVar1 = Writer::write(this->writer_,(int)this,os,CONCAT71(in_register_00000009,in_CL));
    __buf = extraout_RDX;
    if ((char)sVar1 == '\0') {
      return (char *)0x0;
    }
  }
  StringBuffer::write(os,0,__buf,CONCAT71(in_register_00000009,in_CL));
  if ((os->ptr_ == (char *)0x0 | os->error_) == 1) {
    (*(this->super_Lattice)._vptr_Lattice[0x25])(this,"output buffer overflow");
    return (char *)0x0;
  }
  return os->ptr_;
}

Assistant:

const char *LatticeImpl::toStringInternal(StringBuffer *os) {
  os->clear();
  if (writer_) {
    if (!writer_->write(this, os)) {
      return 0;
    }
  } else {
    writeLattice(this, os);
  }
  *os << '\0';
  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }
  return os->str();
}